

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::EncodableOpnd<long>::DumpEncodable(EncodableOpnd<long> *this)

{
  char16 *pcVar1;
  char16 *pcVar2;
  char16_t *form;
  
  if (this->name == (char16 *)0x0) {
    pcVar1 = (char16 *)this->m_value;
    if (this->decodedValue != 0) {
      Output::Print(L"%lld (0x%llX) [encoded: 0x%llX]",this->decodedValue);
      return;
    }
    form = L"%lld (0x%llX)";
    pcVar2 = pcVar1;
  }
  else {
    pcVar1 = (char16 *)this->m_value;
    form = L"<%s> (value: 0x%llX)";
    pcVar2 = this->name;
  }
  Output::Print(form,pcVar2,pcVar1);
  return;
}

Assistant:

void EncodableOpnd<int64>::DumpEncodable() const
{
    if (name != nullptr)
    {
        Output::Print(_u("<%s> (value: 0x%llX)"), name, m_value);
    }
    else if (decodedValue != 0)
    {
        Output::Print(_u("%lld (0x%llX) [encoded: 0x%llX]"), decodedValue, decodedValue, m_value);
    }
    else
    {
        Output::Print(_u("%lld (0x%llX)"), m_value, m_value);
    }
}